

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void EscapeParam(char *pDst,char *pSrc,int size)

{
  char cVar1;
  int iVar2;
  long lVar3;
  
  cVar1 = *pSrc;
  if (1 < size && cVar1 != '\0') {
    lVar3 = 1;
    do {
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        *pDst = '\\';
        pDst = pDst + 1;
        cVar1 = pSrc[lVar3 + -1];
      }
      *pDst = cVar1;
      pDst = pDst + 1;
      cVar1 = pSrc[lVar3];
    } while ((cVar1 != '\0') && (iVar2 = (int)lVar3, lVar3 = lVar3 + 1, iVar2 < size + -1));
  }
  *pDst = '\0';
  return;
}

Assistant:

void EscapeParam(char *pDst, const char *pSrc, int size)
{
	for(int i = 0; *pSrc && i < size - 1; ++i)
	{
		if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
			*pDst++ = '\\';
		*pDst++ = *pSrc++;
	}
	*pDst = 0;
}